

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O0

array<double,_3UL> * __thiscall
Layer::calculate(array<double,_3UL> *__return_storage_ptr__,Layer *this,double h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double C;
  double d;
  double p;
  double T;
  double h_local;
  Layer *this_local;
  
  if ((this->L != 0.0) || (NAN(this->L))) {
    dVar2 = -this->g0 / (this->L * this->R);
    p = temperature(this,h);
    dVar1 = this->p0;
    dVar3 = pow(p / this->T0,dVar2);
    d = dVar1 * dVar3;
    dVar1 = this->d0;
    dVar2 = pow(p / this->T0,dVar2 - 1.0);
    C = dVar1 * dVar2;
  }
  else {
    p = this->T0;
    dVar1 = this->p0;
    dVar2 = exp((-this->g0 / (this->R * this->T0)) * (h - this->h0));
    d = dVar1 * dVar2;
    dVar1 = this->d0;
    dVar2 = exp((-this->g0 / (this->R * this->T0)) * (h - this->h0));
    C = dVar1 * dVar2;
  }
  __return_storage_ptr__->_M_elems[0] = p;
  __return_storage_ptr__->_M_elems[1] = d;
  __return_storage_ptr__->_M_elems[2] = C;
  return __return_storage_ptr__;
}

Assistant:

std::array<double, 3> calculate(double h) {
        double T, p, d;

        if (this->L == 0) {
            T = this->T0;
            p = this->p0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
            d = this->d0 * exp(-this->g0 / (this->R * this->T0) * (h - this->h0));
        } else {
            double C = -this->g0 / (this->L * this->R);
            T = this->temperature(h);
            p = this->p0 * pow((T / this->T0), C);
            d = this->d0 * pow((T / this->T0), C - 1);
        }
        std::array<double, 3> values = {T, p, d};
        return values;
    }